

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O0

void do_pop_up_error_proc(Am_Object *param_1)

{
  ostream *this;
  ostrstream local_280 [8];
  ostrstream oss;
  char local_118 [8];
  char line [250];
  Am_Object *param_0_local;
  
  std::ostrstream::ostrstream(local_280,local_118,0xfa,_S_out);
  this = std::operator<<((ostream *)local_280,"This is an error message");
  std::ostream::operator<<(this,std::ends<char,std::char_traits<char>>);
  Am_Pop_Up_Error_Window(local_118);
  std::ostrstream::~ostrstream(local_280);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_pop_up_error, (Am_Object /*cmd*/))
{
  AM_POP_UP_ERROR_WINDOW("This is an error message");
}